

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

ON_RenderMeshInfo * __thiscall ON_Mesh::GetRenderMeshInfo(ON_Mesh *this)

{
  bool bVar1;
  ON_UserData *this_00;
  ON_RenderMeshInfo *pOVar2;
  ON_UserData *pOVar3;
  ON_UUID local_18;
  
  local_18 = ON_ClassId::Uuid(&CTtRenderMeshInfoUserData::m_CTtRenderMeshInfoUserData_class_rtti);
  this_00 = ON_Object::GetUserData((ON_Object *)this,&local_18);
  if (this_00 == (ON_UserData *)0x0) {
    pOVar3 = (ON_UserData *)0x0;
  }
  else {
    bVar1 = ON_Object::IsKindOf(&this_00->super_ON_Object,
                                &CTtRenderMeshInfoUserData::m_CTtRenderMeshInfoUserData_class_rtti);
    pOVar3 = (ON_UserData *)0x0;
    if (bVar1) {
      pOVar3 = this_00;
    }
  }
  pOVar2 = (ON_RenderMeshInfo *)(pOVar3 + 1);
  if (pOVar3 == (ON_UserData *)0x0) {
    pOVar2 = (ON_RenderMeshInfo *)0x0;
  }
  return pOVar2;
}

Assistant:

const ON_RenderMeshInfo* ON_Mesh::GetRenderMeshInfo() const
{
  CTtRenderMeshInfoUserData* pUD = CTtRenderMeshInfoUserData::Cast(GetUserData(ON_CLASS_ID(CTtRenderMeshInfoUserData)));
  if (nullptr == pUD)
    return nullptr;
  return &pUD->Info();
}